

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# counter.hpp
# Opt level: O1

void __thiscall
ylt::metric::basic_dynamic_counter<long,_(unsigned_char)'\x02'>::remove_label_value
          (basic_dynamic_counter<long,_(unsigned_char)__x02_> *this,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *labels)

{
  atomic<long> *paVar1;
  pointer pbVar2;
  pointer pmVar3;
  const_iterator cVar4;
  size_t sVar5;
  const_iterator __end0;
  long lVar6;
  map_lock_t<std::unordered_map<std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x02_>::value_type,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x02_>::my_hash<131UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x02_>::my_equal,_std::allocator<std::pair<const_std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x02_>::value_type>_>_>_>
  *map;
  pointer this_00;
  const_iterator __begin0;
  pointer __k;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  vec;
  undefined1 local_58 [32];
  char *pcStack_38;
  
  lVar6 = (this->super_dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x02_>).map_.size_.
          super___atomic_base<long>._M_i;
  if (lVar6 < 0) {
    lVar6 = 0;
  }
  if (lVar6 != 0) {
    __k = (this->super_dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x02_>).
          super_dynamic_metric.super_metric_t.labels_name_.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
    pbVar2 = *(pointer *)
              ((long)&(this->super_dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x02_>).
                      super_dynamic_metric.super_metric_t.labels_name_.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data + 8);
    if ((labels->_M_t)._M_impl.super__Rb_tree_header._M_node_count <=
        (ulong)((long)pbVar2 - (long)__k >> 5)) {
      local_58._0_8_ = (void *)0x0;
      local_58._8_8_ = (_Base_ptr)0x0;
      local_58._16_8_ = (_Base_ptr)0x0;
      if (__k == pbVar2) {
        lVar6 = 0;
      }
      else {
        lVar6 = 0;
        do {
          cVar4 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::find(&labels->_M_t,__k);
          if ((_Rb_tree_header *)cVar4._M_node == &(labels->_M_t)._M_impl.super__Rb_tree_header) {
            local_58._24_8_ = (_Base_ptr)0x0;
            pcStack_38 = "";
            if (local_58._8_8_ == local_58._16_8_) {
              std::
              vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
              ::_M_realloc_insert<std::basic_string_view<char,std::char_traits<char>>>
                        ((vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                          *)local_58,(iterator)local_58._8_8_,
                         (basic_string_view<char,_std::char_traits<char>_> *)(local_58 + 0x18));
            }
            else {
              *(size_t *)local_58._8_8_ = 0;
              *(char **)(local_58._8_8_ + 8) = "";
              local_58._8_8_ = local_58._8_8_ + 0x10;
            }
            lVar6 = lVar6 + 1;
          }
          else {
            pcStack_38 = *(char **)(cVar4._M_node + 2);
            local_58._24_8_ = cVar4._M_node[2]._M_parent;
            if (local_58._8_8_ == local_58._16_8_) {
              std::
              vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
              ::_M_realloc_insert<std::basic_string_view<char,std::char_traits<char>>>
                        ((vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                          *)local_58,(iterator)local_58._8_8_,
                         (basic_string_view<char,_std::char_traits<char>_> *)(local_58 + 0x18));
            }
            else {
              *(size_t *)local_58._8_8_ = local_58._24_8_;
              *(char **)(local_58._8_8_ + 8) = pcStack_38;
              local_58._8_8_ = local_58._8_8_ + 0x10;
            }
          }
          __k = __k + 1;
        } while (__k != pbVar2);
      }
      if (lVar6 != (long)*(pointer *)
                          ((long)&(this->
                                  super_dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x02_>
                                  ).super_dynamic_metric.super_metric_t.labels_name_.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data + 8) -
                   (long)(this->super_dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x02_>)
                         .super_dynamic_metric.super_metric_t.labels_name_.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 5) {
        this_00 = (this->super_dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x02_>).map_.
                  shards_.
                  super__Vector_base<ylt::util::internal::map_lock_t<std::unordered_map<std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x02_>::value_type,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x02_>::my_hash<131UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x02_>::my_equal,_std::allocator<std::pair<const_std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x02_>::value_type>_>_>_>,_std::allocator<ylt::util::internal::map_lock_t<std::unordered_map<std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x02_>::value_type,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x02_>::my_hash<131UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x02_>::my_equal,_std::allocator<std::pair<const_std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x02_>::value_type>_>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pmVar3 = (this->super_dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x02_>).map_.
                 shards_.
                 super__Vector_base<ylt::util::internal::map_lock_t<std::unordered_map<std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x02_>::value_type,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x02_>::my_hash<131UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x02_>::my_equal,_std::allocator<std::pair<const_std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x02_>::value_type>_>_>_>,_std::allocator<ylt::util::internal::map_lock_t<std::unordered_map<std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x02_>::value_type,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x02_>::my_hash<131UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x02_>::my_equal,_std::allocator<std::pair<const_std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x02_>::value_type>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        local_58._24_8_ = (_Base_ptr)local_58;
        if (this_00 != pmVar3) {
          local_58._24_8_ = (_Base_ptr)local_58;
          do {
            sVar5 = util::internal::
                    map_lock_t<std::unordered_map<std::span<std::__cxx11::string_const,2ul>,ylt::metric::dynamic_metric_impl<std::atomic<long>,(unsigned_char)2>::value_type,ylt::metric::dynamic_metric_impl<std::atomic<long>,(unsigned_char)2>::my_hash<131ul>,ylt::metric::dynamic_metric_impl<std::atomic<long>,(unsigned_char)2>::my_equal,std::allocator<std::pair<std::span<std::__cxx11::string_const,2ul>const,ylt::metric::dynamic_metric_impl<std::atomic<long>,(unsigned_char)2>::value_type>>>>
                    ::
                    erase_if<ylt::metric::basic_dynamic_counter<long,(unsigned_char)2>::remove_label_value(std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&)::_lambda(auto:1&)_1_&>
                              ((map_lock_t<std::unordered_map<std::span<std::__cxx11::string_const,2ul>,ylt::metric::dynamic_metric_impl<std::atomic<long>,(unsigned_char)2>::value_type,ylt::metric::dynamic_metric_impl<std::atomic<long>,(unsigned_char)2>::my_hash<131ul>,ylt::metric::dynamic_metric_impl<std::atomic<long>,(unsigned_char)2>::my_equal,std::allocator<std::pair<std::span<std::__cxx11::string_const,2ul>const,ylt::metric::dynamic_metric_impl<std::atomic<long>,(unsigned_char)2>::value_type>>>>
                                *)this_00,(anon_class_8_1_ba1d82f4 *)(local_58 + 0x18));
            LOCK();
            paVar1 = &(this->super_dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x02_>).
                      map_.size_;
            (paVar1->super___atomic_base<long>)._M_i =
                 (paVar1->super___atomic_base<long>)._M_i - sVar5;
            UNLOCK();
            this_00 = this_00 + 1;
          } while (this_00 != pmVar3);
        }
      }
      if ((void *)local_58._0_8_ != (void *)0x0) {
        operator_delete((void *)local_58._0_8_,local_58._16_8_ - local_58._0_8_);
      }
    }
  }
  return;
}

Assistant:

void remove_label_value(
      const std::map<std::string, std::string> &labels) override {
    if (Base::empty()) {
      return;
    }

    const auto &labels_name = this->labels_name();
    if (labels.size() > labels_name.size()) {
      return;
    }

    // if (labels.size() == labels_name.size()) {  // TODO: speed up for this
    // case

    // }
    // else {
    size_t count = 0;
    std::vector<std::string_view> vec;
    for (auto &lb_name : labels_name) {
      if (auto i = labels.find(lb_name); i != labels.end()) {
        vec.push_back(i->second);
      }
      else {
        vec.push_back("");
        count++;
      }
    }
    if (count == labels_name.size()) {
      return;
    }
    Base::erase_if([&](auto &pair) {
      auto &[arr, _] = pair;
      if constexpr (N > 0) {
        for (size_t i = 0; i < vec.size(); i++) {
          if (!vec[i].empty() && vec[i] != arr[i]) {
            return false;
          }
        }
      }
      return true;
    });
    //}
  }